

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O2

void __thiscall sfc::Tile::Tile(Tile *this,Image *image,Mode mode,uint bpp,bool no_flip)

{
  index_vec_t *source;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *this_00;
  byte bVar4;
  runtime_error *this_01;
  undefined7 in_register_00000081;
  byte *pbVar5;
  byte local_61;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  undefined4 local_44;
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *local_40;
  rgba_vec_t *local_38;
  
  this->_mode = mode;
  this->_bpp = bpp;
  uVar1 = image->_height;
  this->_width = image->_width;
  this->_height = uVar1;
  source = &this->_data;
  local_40 = (vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->_mirrors;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mirrors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mirrors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mirrors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_palette,&image->_palette)
  ;
  local_38 = &this->_palette;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
             &image->_indexed_data);
  puVar3 = local_60._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = local_60._M_impl.super__Vector_impl_data._M_start;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  if (puVar2 != puVar3) {
    local_44 = (undefined4)CONCAT71(in_register_00000081,no_flip);
    bVar4 = bitmask_at_bpp(this->_bpp);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
               &image->_indexed_data);
    for (pbVar5 = local_60._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != local_60._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      local_61 = *pbVar5 & bVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (source,&local_61);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    if ((char)local_44 == '\0') {
      mirror<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,source,
                 this->_width,true,false);
      this_00 = local_40;
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (local_40,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
      mirror<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,source,
                 this->_width,false,true);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
      mirror<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,source,
                 this->_width,true,true);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Can\'t create tile without indexed data");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Tile::Tile(const Image& image, Mode mode, unsigned bpp, bool no_flip)
    : _mode(mode), _bpp(bpp), _width(image.width()), _height(image.height()), _palette(image.palette()) {
  if (image.indexed_data().empty())
    throw std::runtime_error("Can't create tile without indexed data");

  index_t mask = bitmask_at_bpp(_bpp);
  for (index_t ip : image.indexed_data())
    _data.push_back(ip & mask);

  if (!no_flip) {
    _mirrors.push_back(mirror(_data, _width, true, false));
    _mirrors.push_back(mirror(_data, _width, false, true));
    _mirrors.push_back(mirror(_data, _width, true, true));
  }
}